

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v9::detail::
         write_significand<fmt::v9::appender,char,unsigned_int,fmt::v9::detail::digit_grouping<char>>
                   (appender out,uint significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  appender aVar1;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_230;
  
  if ((grouping->sep_).thousands_sep != '\0') {
    local_230.super_buffer<char>.ptr_ = local_230.store_;
    local_230.super_buffer<char>.size_ = 0;
    local_230.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001cc2c0;
    local_230.super_buffer<char>.capacity_ = 500;
    write_significand<fmt::v9::appender,_unsigned_int,_char,_0>
              ((appender)&local_230,significand,significand_size,integral_size,decimal_point);
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_230.super_buffer<char>.ptr_;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v9::appender,char>(grouping,out,digits);
    aVar1 = copy_str_noinline<char,char*,fmt::v9::appender>
                      (local_230.super_buffer<char>.ptr_ + integral_size,
                       local_230.super_buffer<char>.ptr_ + local_230.super_buffer<char>.size_,out);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_230);
    return (appender)
           aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  aVar1 = write_significand<fmt::v9::appender,_unsigned_int,_char,_0>
                    (out,significand,significand_size,integral_size,decimal_point);
  return (appender)aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}